

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulatingstroker.cpp
# Opt level: O3

void __thiscall QTriangulatingStroker::moveTo(QTriangulatingStroker *this,qreal *pts)

{
  long lVar1;
  QVLAStorage<4UL,_4UL,_256LL> *__s;
  float fVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  qsizetype size;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long in_FS_OFFSET;
  float fVar13;
  float fVar14;
  float fVar15;
  float local_468;
  QVarLengthArray<float,_256LL> local_448;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  dVar3 = *pts;
  dVar4 = pts[1];
  *(ulong *)(this + 0x18) = CONCAT44((float)dVar4,(float)dVar3);
  local_468 = (float)pts[2] - (float)dVar3;
  fVar15 = (float)pts[3] - (float)dVar4;
  fVar14 = *(float *)(this + 0x28);
  fVar13 = hypotf(local_468,fVar15);
  fVar15 = -fVar15 * (fVar14 / fVar13);
  *(float *)(this + 0x20) = fVar15;
  local_468 = (fVar14 / fVar13) * local_468;
  *(float *)(this + 0x24) = local_468;
  lVar6 = *(long *)(this + 8);
  iVar7 = *(int *)(this + 100);
  if (iVar7 == 0x20) {
    __s = &local_448.super_QVLAStorage<4UL,_4UL,_256LL>;
    memset(__s,0xaa,0x400);
    local_448.super_QVLABase<float>.super_QVLABaseBase.a = 0x100;
    local_448.super_QVLABase<float>.super_QVLABaseBase.s = 0;
    fVar14 = *(float *)(this + 0x18);
    fVar13 = *(float *)(this + 0x1c);
    local_448.super_QVLABase<float>.super_QVLABaseBase.ptr = __s;
    arcPoints(this,fVar14,fVar13,fVar15 + fVar14,local_468 + fVar13,fVar14 - fVar15,
              fVar13 - local_468,&local_448);
    lVar12 = (ulong)((uint)(lVar6 != 0) * 2) + *(long *)(this + 8) +
             local_448.super_QVLABase<float>.super_QVLABaseBase.s;
    QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar12);
    *(long *)(this + 8) = lVar12;
    iVar7 = (int)(local_448.super_QVLABase<float>.super_QVLABaseBase.s / 2);
    lVar5 = lVar12;
    if (iVar7 != 0) {
      uVar8 = (ulong)iVar7;
      lVar5 = (long)(int)lVar12;
      lVar1 = *(long *)(this + 0x10) + lVar5 * 4;
      lVar10 = 0;
      uVar11 = 0;
      uVar9 = uVar8;
      do {
        uVar9 = uVar9 - 1;
        *(undefined4 *)(lVar1 + -4 + lVar10 * 4) =
             *(undefined4 *)
              ((char *)local_448.super_QVLABase<float>.super_QVLABaseBase.ptr +
              lVar10 * 2 + uVar8 * 8 + -4);
        *(undefined4 *)(lVar1 + -8 + lVar10 * 4) =
             *(undefined4 *)
              ((char *)local_448.super_QVLABase<float>.super_QVLABaseBase.ptr +
              lVar10 * 2 + uVar8 * 8 + -8);
        if (uVar11 == (uVar9 & 0xffffffff)) {
          lVar5 = lVar5 + lVar10 + -2;
          goto LAB_0043bf9a;
        }
        *(undefined4 *)(lVar1 + -0xc + lVar10 * 4) =
             *(undefined4 *)
              ((char *)local_448.super_QVLABase<float>.super_QVLABaseBase.ptr + uVar11 * 8 + 4);
        *(undefined4 *)(lVar1 + -0x10 + lVar10 * 4) =
             *(undefined4 *)
              ((char *)local_448.super_QVLABase<float>.super_QVLABaseBase.ptr + uVar11 * 8);
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + -4;
      } while (uVar11 != (uVar9 & 0xffffffff));
      lVar5 = lVar5 + lVar10;
    }
LAB_0043bf9a:
    if (lVar6 != 0) {
      *(undefined8 *)(*(long *)(this + 0x10) + -8 + (long)(int)lVar5 * 4) =
           *(undefined8 *)(*(long *)(this + 0x10) + (long)(int)lVar5 * 4);
    }
    if ((QVLAStorage<4UL,_4UL,_256LL> *)local_448.super_QVLABase<float>.super_QVLABaseBase.ptr !=
        __s) {
      QtPrivate::sizedFree
                (local_448.super_QVLABase<float>.super_QVLABaseBase.ptr,
                 local_448.super_QVLABase<float>.super_QVLABaseBase.a << 2);
      lVar12 = *(long *)(this + 8);
    }
    goto LAB_0043bfcf;
  }
  if (iVar7 == 0x10) {
    fVar13 = *(float *)(this + 0x18) - local_468;
    fVar14 = *(float *)(this + 0x1c) + fVar15;
    if (lVar6 == 0) {
      size = 1;
    }
    else {
      QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar6 + 1);
      lVar6 = *(long *)(this + 8);
      *(float *)(*(long *)(this + 0x10) + lVar6 * 4) = fVar15 + fVar13;
      *(long *)(this + 8) = lVar6 + 1;
      fVar15 = *(float *)(this + 0x24);
      QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar6 + 2);
      lVar6 = *(long *)(this + 8);
      *(float *)(*(long *)(this + 0x10) + lVar6 * 4) = fVar15 + fVar14;
      *(long *)(this + 8) = lVar6 + 1;
      fVar15 = *(float *)(this + 0x20);
      local_468 = *(float *)(this + 0x24);
      size = lVar6 + 2;
    }
    QDataBuffer<float>::reserve((QDataBuffer<float> *)this,size);
    lVar6 = *(long *)(this + 8);
    *(float *)(*(long *)(this + 0x10) + lVar6 * 4) = fVar13 + fVar15;
    *(long *)(this + 8) = lVar6 + 1;
    QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar6 + 2);
    lVar6 = *(long *)(this + 8);
    *(float *)(*(long *)(this + 0x10) + lVar6 * 4) = fVar14 + local_468;
    *(long *)(this + 8) = lVar6 + 1;
    QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar6 + 2);
    lVar6 = *(long *)(this + 8);
    *(float *)(*(long *)(this + 0x10) + lVar6 * 4) = fVar13 - fVar15;
    *(long *)(this + 8) = lVar6 + 1;
    fVar14 = fVar14 - local_468;
    QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar6 + 2);
    lVar12 = *(long *)(this + 8);
    lVar6 = *(long *)(this + 0x10);
  }
  else {
    lVar12 = lVar6;
    if (iVar7 != 0) goto LAB_0043bfcf;
    if (lVar6 == 0) {
      lVar12 = 0;
      goto LAB_0043bfcf;
    }
    fVar14 = *(float *)(this + 0x18);
    QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar6 + 1);
    lVar6 = *(long *)(this + 8);
    *(float *)(*(long *)(this + 0x10) + lVar6 * 4) = fVar15 + fVar14;
    *(long *)(this + 8) = lVar6 + 1;
    fVar14 = *(float *)(this + 0x1c) + *(float *)(this + 0x24);
    QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar6 + 2);
    lVar12 = *(long *)(this + 8);
    lVar6 = *(long *)(this + 0x10);
  }
  *(float *)(lVar6 + lVar12 * 4) = fVar14;
  lVar12 = lVar12 + 1;
  *(long *)(this + 8) = lVar12;
LAB_0043bfcf:
  fVar14 = *(float *)(this + 0x18);
  fVar15 = *(float *)(this + 0x1c);
  fVar13 = *(float *)(this + 0x20);
  fVar2 = *(float *)(this + 0x24);
  QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar12 + 1);
  lVar6 = *(long *)(this + 8);
  *(float *)(*(long *)(this + 0x10) + lVar6 * 4) = fVar14 + fVar13;
  *(long *)(this + 8) = lVar6 + 1;
  QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar6 + 2);
  lVar6 = *(long *)(this + 8);
  *(float *)(*(long *)(this + 0x10) + lVar6 * 4) = fVar15 + fVar2;
  *(long *)(this + 8) = lVar6 + 1;
  QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar6 + 2);
  lVar6 = *(long *)(this + 8);
  *(float *)(*(long *)(this + 0x10) + lVar6 * 4) = fVar14 - fVar13;
  *(long *)(this + 8) = lVar6 + 1;
  QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar6 + 2);
  lVar6 = *(long *)(this + 8);
  *(float *)(*(long *)(this + 0x10) + lVar6 * 4) = fVar15 - fVar2;
  *(long *)(this + 8) = lVar6 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTriangulatingStroker::moveTo(const qreal *pts)
{
    m_cx = pts[0];
    m_cy = pts[1];

    float x2 = pts[2];
    float y2 = pts[3];
    normalVector(m_cx, m_cy, x2, y2, &m_nvx, &m_nvy);


    // To achieve jumps we insert zero-area tringles. This is done by
    // adding two identical points in both the end of previous strip
    // and beginning of next strip
    bool invisibleJump = m_vertices.size();

    switch (m_cap_style) {
    case Qt::FlatCap:
        if (invisibleJump) {
            m_vertices.add(m_cx + m_nvx);
            m_vertices.add(m_cy + m_nvy);
        }
        break;
    case Qt::SquareCap: {
        float sx = m_cx - m_nvy;
        float sy = m_cy + m_nvx;
        if (invisibleJump) {
            m_vertices.add(sx + m_nvx);
            m_vertices.add(sy + m_nvy);
        }
        emitLineSegment(sx, sy, m_nvx, m_nvy);
        break; }
    case Qt::RoundCap: {
        QVarLengthArray<float> points;
        arcPoints(m_cx, m_cy, m_cx + m_nvx, m_cy + m_nvy, m_cx - m_nvx, m_cy - m_nvy, points);
        m_vertices.resize(m_vertices.size() + points.size() + 2 * int(invisibleJump));
        int count = m_vertices.size();
        int front = 0;
        int end = points.size() / 2;
        while (front != end) {
            m_vertices.at(--count) = points[2 * end - 1];
            m_vertices.at(--count) = points[2 * end - 2];
            --end;
            if (front == end)
                break;
            m_vertices.at(--count) = points[2 * front + 1];
            m_vertices.at(--count) = points[2 * front + 0];
            ++front;
        }

        if (invisibleJump) {
            m_vertices.at(count - 1) = m_vertices.at(count + 1);
            m_vertices.at(count - 2) = m_vertices.at(count + 0);
        }
        break; }
    default: break; // ssssh gcc...
    }
    emitLineSegment(m_cx, m_cy, m_nvx, m_nvy);
}